

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateRotationNodeAnim
          (FBXConverter *this,string *name,Model *target,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> start_00;
  RotOrder order;
  aiNodeAnim *this_00;
  pointer paVar1;
  aiVectorKey *paVar2;
  aiVectorKey *local_100;
  aiVectorKey *local_d8;
  aiVector3t<float> local_6c;
  aiVector3t<float> local_60 [2];
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> local_48;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  int64_t start_local;
  LayerMap *layer_map_local;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *curves_local;
  Model *target_local;
  string *name_local;
  FBXConverter *this_local;
  
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)start;
  this_00 = (aiNodeAnim *)operator_new(0x438);
  aiNodeAnim::aiNodeAnim(this_00);
  std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>::
  unique_ptr<std::default_delete<aiNodeAnim>,void>
            ((unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>> *)&local_48,this_00);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  aiString::Set(&paVar1->mNodeName,name);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::get(&local_48);
  start_00 = na;
  order = Model::RotationOrder(target);
  ConvertRotationKeys(this,paVar1,curves,layer_map,
                      (int64_t)start_00._M_t.
                               super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                               .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,stop,
                      max_time,min_time,order);
  paVar2 = (aiVectorKey *)operator_new__(0x18);
  local_d8 = paVar2;
  do {
    aiVectorKey::aiVectorKey(local_d8);
    local_d8 = local_d8 + 1;
  } while (local_d8 != paVar2 + 1);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar1->mScalingKeys = paVar2;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar1->mNumScalingKeys = 1;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar1->mScalingKeys->mTime = 0.0;
  aiVector3t<float>::aiVector3t(local_60,1.0,1.0,1.0);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar2 = paVar1->mScalingKeys;
  (paVar2->mValue).z = local_60[0].z;
  (paVar2->mValue).x = local_60[0].x;
  (paVar2->mValue).y = local_60[0].y;
  paVar2 = (aiVectorKey *)operator_new__(0x18);
  local_100 = paVar2;
  do {
    aiVectorKey::aiVectorKey(local_100);
    local_100 = local_100 + 1;
  } while (local_100 != paVar2 + 1);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar1->mPositionKeys = paVar2;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar1->mNumPositionKeys = 1;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar1->mPositionKeys->mTime = 0.0;
  aiVector3t<float>::aiVector3t(&local_6c);
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::operator->(&local_48);
  paVar2 = paVar1->mPositionKeys;
  (paVar2->mValue).x = local_6c.x;
  (paVar2->mValue).y = local_6c.y;
  (paVar2->mValue).z = local_6c.z;
  paVar1 = std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::release(&local_48);
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&local_48);
  return paVar1;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateRotationNodeAnim(const std::string& name,
            const Model& target,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertRotationKeys(na.get(), curves, layer_map, start, stop, max_time, min_time, target.RotationOrder());

            // dummy scaling key
            na->mScalingKeys = new aiVectorKey[1];
            na->mNumScalingKeys = 1;

            na->mScalingKeys[0].mTime = 0.;
            na->mScalingKeys[0].mValue = aiVector3D(1.0f, 1.0f, 1.0f);

            // dummy position key
            na->mPositionKeys = new aiVectorKey[1];
            na->mNumPositionKeys = 1;

            na->mPositionKeys[0].mTime = 0.;
            na->mPositionKeys[0].mValue = aiVector3D();

            return na.release();
        }